

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleIncomplete(RunContext *this,AssertionInfo *info)

{
  undefined8 uVar1;
  ITransientExpression *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_type sVar5;
  undefined8 *in_RSI;
  AssertionResultData *in_RDI;
  AssertionResult *in_stack_00000008;
  RunContext *in_stack_00000010;
  AssertionResult assertionResult;
  AssertionResultData data;
  AssertionInfo *info_00;
  AssertionResult *this_00;
  LazyExpression *in_stack_fffffffffffffef0;
  OfType in_stack_fffffffffffffefc;
  AssertionResultData *in_stack_ffffffffffffff00;
  undefined1 local_78 [120];
  
  *(undefined4 *)&in_RDI[5].message.field_2 = *(undefined4 *)(in_RSI + 6);
  uVar1 = *in_RSI;
  pIVar2 = (ITransientExpression *)in_RSI[1];
  uVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  sVar5 = in_RSI[5];
  *(undefined8 *)&in_RDI[5].message = in_RSI[4];
  in_RDI[5].message._M_string_length = sVar5;
  *(undefined8 *)&in_RDI[4].lazyExpression.m_isNegated = uVar3;
  *(undefined8 *)&in_RDI[4].resultType = uVar4;
  *(undefined8 *)((long)&in_RDI[4].reconstructedExpression.field_2 + 8) = uVar1;
  in_RDI[4].lazyExpression.m_transientExpression = pIVar2;
  info_00 = (AssertionInfo *)local_78;
  LazyExpression::LazyExpression((LazyExpression *)info_00,false);
  this_00 = (AssertionResult *)(local_78 + 0x10);
  AssertionResultData::AssertionResultData
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
  std::__cxx11::string::operator=
            ((string *)this_00,"Exception translation was disabled by CATCH_CONFIG_FAST_COMPILE");
  AssertionResult::AssertionResult(this_00,info_00,in_RDI);
  assertionEnded(in_stack_00000010,in_stack_00000008);
  AssertionResult::~AssertionResult((AssertionResult *)0x140acf);
  AssertionResultData::~AssertionResultData(in_RDI);
  return;
}

Assistant:

void RunContext::handleIncomplete(
            AssertionInfo const& info
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = "Exception translation was disabled by CATCH_CONFIG_FAST_COMPILE";
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );
    }